

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS
ref_cavity_form_insert_tet
          (REF_CAVITY ref_cavity,REF_GRID_conflict ref_grid,REF_INT node,REF_INT site,
          REF_INT protect)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  bool bVar1;
  uint uVar2;
  bool bVar3;
  REF_INT local_9c;
  REF_INT local_94;
  int local_90;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_BOOL protected_cell;
  REF_INT cell_node;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT face_nodes [3];
  REF_BOOL all_local;
  REF_BOOL already_have_it;
  REF_BOOL has_node;
  REF_INT cell;
  REF_INT face_node;
  REF_INT cell_face;
  REF_INT item;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_INT protect_local;
  REF_INT site_local;
  REF_INT node_local;
  REF_GRID_conflict ref_grid_local;
  REF_CAVITY ref_cavity_local;
  
  ref_node_00 = ref_grid->node;
  ref_cavity_local._4_4_ = ref_cavity_form_empty(ref_cavity,ref_grid,node);
  if (ref_cavity_local._4_4_ == 0) {
    if ((ref_node_00->ref_mpi->id == ref_node_00->part[node]) &&
       (ref_node_00->ref_mpi->id == ref_node_00->part[site])) {
      if ((ref_grid->cell[9]->n < 1) && (ref_grid->cell[10]->n < 1)) {
        ref_cell_00 = ref_grid->cell[8];
        if ((site < 0) || (ref_cell_00->ref_adj->nnode <= site)) {
          local_90 = -1;
        }
        else {
          local_90 = ref_cell_00->ref_adj->first[site];
        }
        face_node = local_90;
        if (local_90 == -1) {
          local_94 = -1;
        }
        else {
          local_94 = ref_cell_00->ref_adj->item[local_90].ref;
        }
        already_have_it = local_94;
        while (face_node != -1) {
          bVar3 = false;
          for (ref_private_macro_code_rss_1 = 0;
              ref_private_macro_code_rss_1 < ref_cell_00->node_per;
              ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
            bVar1 = !bVar3;
            bVar3 = true;
            if (bVar1) {
              bVar3 = protect ==
                      ref_cell_00->c2n
                      [ref_private_macro_code_rss_1 + ref_cell_00->size_per * already_have_it];
            }
          }
          if (!bVar3) {
            uVar2 = ref_list_contains(ref_cavity->tet_list,already_have_it,face_nodes + 2);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x4ea,"ref_cavity_form_insert_tet",(ulong)uVar2,"have tet?");
              return uVar2;
            }
            if (face_nodes[2] != 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x4eb,"ref_cavity_form_insert_tet","added tet twice?");
              return 1;
            }
            uVar2 = ref_list_push(ref_cavity->tet_list,already_have_it);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x4ec,"ref_cavity_form_insert_tet",(ulong)uVar2,"save tet");
              return uVar2;
            }
            uVar2 = ref_cell_all_local(ref_cell_00,ref_node_00,already_have_it,face_nodes + 1);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x4ed,"ref_cavity_form_insert_tet",(ulong)uVar2,"local cell");
              return uVar2;
            }
            if (face_nodes[1] == 0) {
              ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
              return 0;
            }
            for (cell = 0; cell < ref_cell_00->face_per; cell = cell + 1) {
              for (has_node = 0; has_node < 3; has_node = has_node + 1) {
                (&cell_node)[has_node] =
                     ref_cell_00->c2n
                     [ref_cell_00->f2n[has_node + cell * 4] +
                      ref_cell_00->size_per * already_have_it];
              }
              bVar3 = true;
              if ((node != cell_node) && (bVar3 = true, node != ref_private_macro_code_rss)) {
                bVar3 = node == face_nodes[0];
              }
              if ((!bVar3) && (uVar2 = ref_cavity_insert_face(ref_cavity,&cell_node), uVar2 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x4fa,"ref_cavity_form_insert_tet",(ulong)uVar2,"tet side");
                return uVar2;
              }
            }
          }
          face_node = ref_cell_00->ref_adj->item[face_node].next;
          if (face_node == -1) {
            local_9c = -1;
          }
          else {
            local_9c = ref_cell_00->ref_adj->item[face_node].ref;
          }
          already_have_it = local_9c;
        }
        ref_cavity_local._4_4_ = ref_cavity_verify_face_manifold(ref_cavity);
        if (ref_cavity_local._4_4_ == 0) {
          ref_cavity_local._4_4_ = ref_cavity_verify_seg_manifold(ref_cavity);
          if (ref_cavity_local._4_4_ == 0) {
            ref_cavity_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x500,"ref_cavity_form_insert_tet",(ulong)ref_cavity_local._4_4_,
                   "ball seg manifold");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x4ff,"ref_cavity_form_insert_tet",(ulong)ref_cavity_local._4_4_,
                 "ball face manifold");
        }
      }
      else {
        ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
        ref_cavity_local._4_4_ = 0;
      }
    }
    else {
      ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
      ref_cavity_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x4d2,
           "ref_cavity_form_insert_tet",(ulong)ref_cavity_local._4_4_,"init form empty");
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_insert_tet(REF_CAVITY ref_cavity,
                                              REF_GRID ref_grid, REF_INT node,
                                              REF_INT site, REF_INT protect) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell_face, face_node, cell;
  REF_BOOL has_node;
  REF_BOOL already_have_it, all_local;
  REF_INT face_nodes[3];

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node), "init form empty");
  if (!ref_node_owned(ref_node, node) || !ref_node_owned(ref_node, site)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node(ref_cell, site, item, cell) {
    REF_INT cell_node;
    REF_BOOL protected_cell = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, cell_node) {
      protected_cell = protected_cell ||
                       (protect == ref_cell_c2n(ref_cell, cell_node, cell));
    }
    if (protected_cell) continue;
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tet twice?");
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
    each_ref_cell_cell_face(ref_cell, cell_face) {
      each_ref_cavity_face_node(ref_cavity, face_node) {
        face_nodes[face_node] =
            ref_cell_f2n(ref_cell, face_node, cell_face, cell);
      }
      has_node = (node == face_nodes[0] || node == face_nodes[1] ||
                  node == face_nodes[2]);
      if (!has_node) {
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
      }
    }
  }

  RSS(ref_cavity_verify_face_manifold(ref_cavity), "ball face manifold");
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "ball seg manifold");

  return REF_SUCCESS;
}